

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

strconv_attribute_t pugi::impl::anon_unknown_0::get_strconv_attribute(uint optmask)

{
  code *pcStack_10;
  uint optmask_local;
  
  switch(optmask >> 4 & 0xf) {
  case 0:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_simple;
    break;
  case 1:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_simple;
    break;
  case 2:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_eol;
    break;
  case 3:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_eol;
    break;
  case 4:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wconv;
    break;
  case 5:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wconv;
    break;
  case 6:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wconv;
    break;
  case 7:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wconv;
    break;
  case 8:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wnorm;
    break;
  case 9:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wnorm;
    break;
  case 10:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wnorm;
    break;
  case 0xb:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wnorm;
    break;
  case 0xc:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wnorm;
    break;
  case 0xd:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wnorm;
    break;
  case 0xe:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wnorm;
    break;
  case 0xf:
    pcStack_10 = strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wnorm;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0xb64,
                  "strconv_attribute_t pugi::impl::(anonymous namespace)::get_strconv_attribute(unsigned int)"
                 );
  }
  return pcStack_10;
}

Assistant:

PUGI__FN strconv_attribute_t get_strconv_attribute(unsigned int optmask)
	{
		PUGI__STATIC_ASSERT(parse_escapes == 0x10 && parse_eol == 0x20 && parse_wconv_attribute == 0x40 && parse_wnorm_attribute == 0x80);

		switch ((optmask >> 4) & 15) // get bitmask for flags (wnorm wconv eol escapes); this simultaneously checks 4 options from assertion above
		{
		case 0:  return strconv_attribute_impl<opt_false>::parse_simple;
		case 1:  return strconv_attribute_impl<opt_true>::parse_simple;
		case 2:  return strconv_attribute_impl<opt_false>::parse_eol;
		case 3:  return strconv_attribute_impl<opt_true>::parse_eol;
		case 4:  return strconv_attribute_impl<opt_false>::parse_wconv;
		case 5:  return strconv_attribute_impl<opt_true>::parse_wconv;
		case 6:  return strconv_attribute_impl<opt_false>::parse_wconv;
		case 7:  return strconv_attribute_impl<opt_true>::parse_wconv;
		case 8:  return strconv_attribute_impl<opt_false>::parse_wnorm;
		case 9:  return strconv_attribute_impl<opt_true>::parse_wnorm;
		case 10: return strconv_attribute_impl<opt_false>::parse_wnorm;
		case 11: return strconv_attribute_impl<opt_true>::parse_wnorm;
		case 12: return strconv_attribute_impl<opt_false>::parse_wnorm;
		case 13: return strconv_attribute_impl<opt_true>::parse_wnorm;
		case 14: return strconv_attribute_impl<opt_false>::parse_wnorm;
		case 15: return strconv_attribute_impl<opt_true>::parse_wnorm;
		default: assert(false); return 0; // unreachable
		}
	}